

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O2

int drmp3_hdr_frame_bytes(drmp3_uint8 *h,int free_format_size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = drmp3_hdr_frame_samples(h);
  uVar2 = drmp3_hdr_bitrate_kbps(h);
  uVar3 = drmp3_hdr_sample_rate_hz(h);
  uVar3 = (uVar2 * uVar1 * 0x7d) / uVar3;
  if ((~h[1] & 6) == 0) {
    uVar3 = uVar3 & 0x7fffffc;
  }
  if (uVar3 == 0) {
    uVar3 = free_format_size;
  }
  return uVar3;
}

Assistant:

static int drmp3_hdr_frame_bytes(const drmp3_uint8 *h, int free_format_size)
{
    int frame_bytes = drmp3_hdr_frame_samples(h)*drmp3_hdr_bitrate_kbps(h)*125/drmp3_hdr_sample_rate_hz(h);
    if (DRMP3_HDR_IS_LAYER_1(h))
    {
        frame_bytes &= ~3; /* slot align */
    }
    return frame_bytes ? frame_bytes : free_format_size;
}